

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O2

void dgrminer::save_pattern_anomaly
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list,
               set<int,_std::less<int>,_std::allocator<int>_> *graph_ids,
               results_crate_anomalies *results_anomaly,bool set_of_graphs,PartialUnion *pu,
               int anomaly_id_of_explanation_pattern,double anomaly_outlierness,bool verbose)

{
  pointer paVar1;
  _Rep_type *p_Var2;
  size_type sVar3;
  _Base_ptr p_Var4;
  long lVar5;
  size_t i;
  ulong uVar6;
  allocator_type local_d9;
  array<int,_6UL> result_edge;
  int anomaly_id_of_explanation_pattern_local;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *local_98;
  double anomaly_outlierness_local;
  set<int,_std::less<int>,_std::allocator<int>_> *local_88;
  PartialUnion *local_80;
  vector<int,_std::allocator<int>_> occurrences_vector;
  set<int,_std::less<int>,_std::allocator<int>_> already_saved_node_ids;
  
  results_anomaly->anomaly_saved_instances = results_anomaly->anomaly_saved_instances + 1;
  anomaly_id_of_explanation_pattern_local = anomaly_id_of_explanation_pattern;
  anomaly_outlierness_local = anomaly_outlierness;
  local_88 = graph_ids;
  local_80 = pu;
  if (verbose) {
    println<char[17],int,char[16],double>
              ((char (*) [17])"ANOMALY PATTERN ",&results_anomaly->anomaly_saved_instances,
               (char (*) [16])", OUTLIERNESS: ",&anomaly_outlierness_local);
  }
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = &results_anomaly->anomaly_result_nodes;
  lVar5 = 0;
  uVar6 = 0;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    paVar1 = (edge_list->
             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(edge_list->
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)paVar1) / 0x28) <= uVar6)
    break;
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      (&already_saved_node_ids,(key_type *)((long)paVar1->_M_elems + lVar5));
    if (sVar3 == 0) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &already_saved_node_ids,
                 (int *)((long)((edge_list->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5));
      paVar1 = (edge_list->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      result_edge._M_elems[1] = *(int *)((long)paVar1->_M_elems + lVar5);
      result_edge._M_elems[0] = results_anomaly->anomaly_saved_instances;
      result_edge._M_elems[3] = *(int *)((long)paVar1->_M_elems + lVar5 + 0xc);
      result_edge._M_elems[2] = *(int *)((long)paVar1->_M_elems + lVar5 + 8);
      std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
                (local_98,(value_type *)&result_edge);
    }
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      (&already_saved_node_ids,
                       (key_type *)
                       ((long)((edge_list->
                               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5 + 4));
    if (sVar3 == 0) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &already_saved_node_ids,
                 (int *)((long)((edge_list->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5 + 4));
      paVar1 = (edge_list->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      result_edge._M_elems[1] = *(int *)((long)paVar1->_M_elems + lVar5 + 4);
      result_edge._M_elems[0] = results_anomaly->anomaly_saved_instances;
      result_edge._M_elems[3] = *(int *)((long)paVar1->_M_elems + lVar5 + 0x20);
      result_edge._M_elems[2] = *(int *)((long)paVar1->_M_elems + lVar5 + 0x1c);
      std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
                (local_98,(value_type *)&result_edge);
    }
    paVar1 = (edge_list->
             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    result_edge._M_elems[1] = *(int *)((long)paVar1->_M_elems + lVar5);
    result_edge._M_elems[0] = results_anomaly->anomaly_saved_instances;
    result_edge._M_elems[3] = *(int *)((long)paVar1->_M_elems + lVar5 + 0x14);
    result_edge._M_elems[2] = *(int *)((long)paVar1->_M_elems + lVar5 + 4);
    result_edge._M_elems[5] = *(int *)((long)paVar1->_M_elems + lVar5 + 0x18);
    result_edge._M_elems[4] = *(int *)((long)paVar1->_M_elems + lVar5 + 0x10);
    std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::push_back
              (&results_anomaly->anomaly_result_edges,&result_edge);
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x28;
  }
  std::vector<int,_std::allocator<int>_>::push_back
            (&results_anomaly->anomaly_id_of_anomalous_pattern,
             &results_anomaly->anomaly_saved_instances);
  std::vector<int,_std::allocator<int>_>::push_back
            (&results_anomaly->anomaly_id_of_explanation_pattern,
             &anomaly_id_of_explanation_pattern_local);
  std::vector<double,_std::allocator<double>_>::push_back
            (&results_anomaly->anomaly_outlierness,&anomaly_outlierness_local);
  if (set_of_graphs) {
    result_edge._M_elems._8_8_ = result_edge._M_elems._8_8_ & 0xffffffff00000000;
    result_edge._M_elems[4] = 0;
    result_edge._M_elems[5] = 0;
    p_Var2 = &local_88->_M_t;
    for (p_Var4 = (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(p_Var2->_M_impl).super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      occurrences_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           PartialUnion::queryMappingSnapshotsToGraphs(local_80,p_Var4[1]._M_color);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &result_edge,(int *)&occurrences_vector);
    }
    std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
              ((vector<int,std::allocator<int>> *)&occurrences_vector,
               (_Base_ptr)(result_edge._M_elems + 2),(_Base_ptr)(result_edge._M_elems + 2),&local_d9
              );
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&results_anomaly->anomaly_occurrences,&occurrences_vector);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&occurrences_vector.super__Vector_base<int,_std::allocator<int>_>);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &result_edge);
  }
  else {
    result_edge._M_elems[4] = 0;
    result_edge._M_elems[5] = 0;
    result_edge._M_elems[0] = 0;
    result_edge._M_elems[1] = 0;
    result_edge._M_elems[2] = 0;
    result_edge._M_elems[3] = 0;
    std::__copy_move<false,false,std::bidirectional_iterator_tag>::
    __copy_m<std::_Rb_tree_const_iterator<int>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
              ((local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<int>)&(local_88->_M_t)._M_impl.super__Rb_tree_header,
               (vector<int,_std::allocator<int>_> *)&result_edge);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&results_anomaly->anomaly_occurrences,(value_type *)&result_edge);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&result_edge);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&already_saved_node_ids._M_t);
  return;
}

Assistant:

void save_pattern_anomaly(std::vector<std::array<int, PAT___SIZE>> &edge_list, std::set<int> &graph_ids,
                              results_crate_anomalies * results_anomaly, bool set_of_graphs, PartialUnion pu,
                              int anomaly_id_of_explanation_pattern, double anomaly_outlierness,
                              bool verbose = false)
	{
		results_anomaly->anomaly_saved_instances++;

        debug_println(verbose, "ANOMALY PATTERN ", results_anomaly->anomaly_saved_instances, ", OUTLIERNESS: ",
                      anomaly_outlierness);

		//anomaly_result_edges, anomaly_result_nodes
		std::set<int> already_saved_node_ids;
		for (size_t i = 0; i < edge_list.size(); i++)
		{
			if (already_saved_node_ids.count(edge_list[i][0]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][0]);
				std::array<int, 4> result_node = { results_anomaly->anomaly_saved_instances, edge_list[i][0], edge_list[i][2], edge_list[i][3] };
				results_anomaly->anomaly_result_nodes.push_back(result_node);
			}
			if (already_saved_node_ids.count(edge_list[i][1]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][1]);
				std::array<int, 4> result_node = { results_anomaly->anomaly_saved_instances, edge_list[i][1], edge_list[i][7], edge_list[i][8] };
				results_anomaly->anomaly_result_nodes.push_back(result_node);
			}

			std::array<int, 6> result_edge = { results_anomaly->anomaly_saved_instances, edge_list[i][0], edge_list[i][1], edge_list[i][5], edge_list[i][4], edge_list[i][6] };
			results_anomaly->anomaly_result_edges.push_back(result_edge);
		}


		//anomaly_id_of_anomalous_pattern
		results_anomaly->anomaly_id_of_anomalous_pattern.push_back(results_anomaly->anomaly_saved_instances);

		//anomaly_id_of_explanation_pattern
		results_anomaly->anomaly_id_of_explanation_pattern.push_back(anomaly_id_of_explanation_pattern);

		//anomaly_outlierness
		results_anomaly->anomaly_outlierness.push_back(anomaly_outlierness);

		//anomaly_occurrences
		if (set_of_graphs)
		{
			std::set<int> occurrences_set;
			for (std::set<int>::iterator it = graph_ids.begin(); it != graph_ids.end(); ++it)
				//for (int j = 0; j < graph_ids.size(); j++)
			{
				occurrences_set.insert(pu.queryMappingSnapshotsToGraphs(*it));
			}
			std::vector<int> occurrences_vector(occurrences_set.begin(), occurrences_set.end());
			results_anomaly->anomaly_occurrences.push_back(occurrences_vector);
		}
		else
		{
			std::vector<int> new_;
			std::copy(graph_ids.begin(), graph_ids.end(), std::back_inserter(new_));
			results_anomaly->anomaly_occurrences.push_back(new_);
		}

	}